

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::Cost::costFirstPartialDerivativeWRTState
          (Cost *this,double param_2,VectorDynSize *param_3,VectorDynSize *param_4,
          VectorDynSize *param_5)

{
  ostream *poVar1;
  string *psVar2;
  char *pcVar3;
  Cost *in_RDI;
  ostringstream errorMsg;
  string local_1d0 [48];
  ostringstream local_1a0 [416];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"Method not implemented for cost ");
  psVar2 = name_abi_cxx11_(in_RDI);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iDynTree::reportError("Cost","costFirstPartialDerivativeWRTState",pcVar3);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return false;
}

Assistant:

bool Cost::costFirstPartialDerivativeWRTState(double /*time*/, const VectorDynSize &/*state*/, const VectorDynSize &/*control*/, VectorDynSize &/*partialDerivative*/)
        {
            std::ostringstream errorMsg;
            errorMsg << "Method not implemented for cost "<< name() << std::endl;
            reportError("Cost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
            return false;
        }